

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void __thiscall
helics::ValueFederate::publishBytes(ValueFederate *this,Publication *pub,data_view *block)

{
  string_view message;
  Modes MVar1;
  undefined8 uVar2;
  char *in_RDX;
  data_view *in_RDI;
  Publication *in_stack_ffffffffffffffd8;
  ValueFederateManager *in_stack_ffffffffffffffe0;
  
  MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x28ad92);
  if (MVar1 != EXECUTING) {
    MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x28adab);
    if (MVar1 != INITIALIZING) {
      uVar2 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&in_RDI->dblock,in_RDX);
      message._M_str = &in_stack_ffffffffffffffe0->useJsonSerialization;
      message._M_len = (size_t)in_stack_ffffffffffffffd8;
      InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)in_RDI,message);
      __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
  }
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                *)0x28adbd);
  ValueFederateManager::publish(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  return;
}

Assistant:

void ValueFederate::publishBytes(const Publication& pub, data_view block)  // NOLINT
{
    if ((currentMode == Modes::EXECUTING) || (currentMode == Modes::INITIALIZING)) {
        vfManager->publish(pub, block);
    } else {
        throw(InvalidFunctionCall(
            "publications not allowed outside of execution and initialization state"));
    }
}